

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

PixelSensor *
pbrt::PixelSensor::Create
          (ParameterDictionary *parameters,RGBColorSpace *colorSpace,Float exposureTime,FileLoc *loc
          ,Allocator alloc)

{
  bool bVar1;
  PixelSensor *pPVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float whiteBalanceTemp;
  string sensorName;
  Float imagingRatio;
  string local_88;
  SpectrumHandle b;
  SpectrumHandle g;
  RGBColorSpace *colorSpace_local;
  Allocator alloc_local;
  SpectrumHandle r;
  
  colorSpace_local = colorSpace;
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sensorName,"fnumber",(allocator<char> *)&local_88);
  FVar3 = ParameterDictionary::GetOneFloat(parameters,&sensorName,1.0);
  std::__cxx11::string::~string((string *)&sensorName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sensorName,"iso",(allocator<char> *)&local_88);
  FVar4 = ParameterDictionary::GetOneFloat(parameters,&sensorName,100.0);
  std::__cxx11::string::~string((string *)&sensorName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sensorName,"c",(allocator<char> *)&local_88);
  FVar5 = ParameterDictionary::GetOneFloat(parameters,&sensorName,314.15927);
  std::__cxx11::string::~string((string *)&sensorName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sensorName,"whitebalance",(allocator<char> *)&local_88);
  FVar6 = ParameterDictionary::GetOneFloat(parameters,&sensorName,0.0);
  std::__cxx11::string::~string((string *)&sensorName);
  whiteBalanceTemp = FVar6;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"sensor",(allocator<char> *)&g);
  std::__cxx11::string::string<std::allocator<char>>((string *)&r,"cie1931",(allocator<char> *)&b);
  ParameterDictionary::GetOneString(&sensorName,parameters,&local_88,(string *)&r);
  std::__cxx11::string::~string((string *)&r);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = std::operator!=(&sensorName,"cie1931");
  if (((bVar1) && (whiteBalanceTemp == 0.0)) && (!NAN(whiteBalanceTemp))) {
    whiteBalanceTemp = 6500.0;
  }
  imagingRatio = (exposureTime * 3.1415927 * FVar4 * 683.0) / (FVar3 * FVar3 * FVar5);
  bVar1 = std::operator==(&sensorName,"cie1931");
  if (bVar1) {
    pPVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::PixelSensor,pbrt::RGBColorSpace_const*&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&alloc_local,&colorSpace_local,&whiteBalanceTemp,&imagingRatio,&alloc_local)
    ;
  }
  else {
    std::operator+(&local_88,&sensorName,"_r");
    GetNamedSpectrum((pbrt *)&r,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::operator+(&local_88,&sensorName,"_g");
    GetNamedSpectrum((pbrt *)&g,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::operator+(&local_88,&sensorName,"_b");
    GetNamedSpectrum((pbrt *)&b,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (((((ulong)r.
                  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                  .bits & 0xffffffffffff) == 0) ||
        (((ulong)g.
                 super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 .bits & 0xffffffffffff) == 0)) ||
       (((ulong)b.
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                .bits & 0xffffffffffff) == 0)) {
      ErrorExit<std::__cxx11::string&>(loc,"%s: unknown sensor type",&sensorName);
    }
    pPVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::PixelSensor,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,pbrt::RGBColorSpace_const*&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                       (&alloc_local,&r,&g,&b,&colorSpace_local,&whiteBalanceTemp,&imagingRatio,
                        &alloc_local);
  }
  std::__cxx11::string::~string((string *)&sensorName);
  return pPVar2;
}

Assistant:

PixelSensor *PixelSensor::Create(const ParameterDictionary &parameters,
                                 const RGBColorSpace *colorSpace, Float exposureTime,
                                 const FileLoc *loc, Allocator alloc) {
    // Imaging ratio parameters
    // The defaults here represent a "passthrough" setup such that the imaging
    // ratio will be exactly 1. This is a useful default since scenes that
    // weren't authored with a physical camera in mind will render as expected.
    Float fNumber = parameters.GetOneFloat("fnumber", 1.);
    Float ISO = parameters.GetOneFloat("iso", 100.);
    // Note: in the talk we mention using 312.5 for historical reasons. The
    // choice of 100 * Pi here just means that the other parameters make nice
    // "round" numbers like 1 and 100.
    Float C = parameters.GetOneFloat("c", 100.0 * Pi);
    Float whiteBalanceTemp = parameters.GetOneFloat("whitebalance", 0);

    std::string sensorName = parameters.GetOneString("sensor", "cie1931");

    // Pass through 0 for cie1931 if it's unspecified so that it doesn't do
    // any white balancing. For actual sensors, 6500 is the default...
    if (sensorName != "cie1931" && whiteBalanceTemp == 0)
        whiteBalanceTemp = 6500;

    Float imagingRatio = Pi * exposureTime * ISO * K_m / (C * fNumber * fNumber);

    if (sensorName == "cie1931") {
        return alloc.new_object<PixelSensor>(colorSpace, whiteBalanceTemp, imagingRatio,
                                             alloc);
    } else {
        SpectrumHandle r = GetNamedSpectrum(sensorName + "_r");
        SpectrumHandle g = GetNamedSpectrum(sensorName + "_g");
        SpectrumHandle b = GetNamedSpectrum(sensorName + "_b");

        if (!r || !g || !b)
            ErrorExit(loc, "%s: unknown sensor type", sensorName);

        return alloc.new_object<PixelSensor>(r, g, b, colorSpace, whiteBalanceTemp,
                                             imagingRatio, alloc);
    }
}